

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

int katherine_set_acq_time(katherine_device_t *device,double ns)

{
  int iVar1;
  
  iVar1 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar1 == 0) {
    iVar1 = katherine_cmd6_long(&device->control_socket,'\x01',(long)(ns / 10.0) & 0xffffffff);
    if (iVar1 == 0) {
      iVar1 = katherine_cmd_wait_ack(&device->control_socket);
      if (iVar1 == 0) {
        iVar1 = katherine_cmd6_long(&device->control_socket,'\n',(ulong)(long)(ns / 10.0) >> 0x20);
        if (iVar1 == 0) {
          iVar1 = katherine_cmd_wait_ack(&device->control_socket);
        }
      }
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar1;
}

Assistant:

int
katherine_set_acq_time(katherine_device_t *device, double ns)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    long acqt = (long) (ns / 10.);
    long lsb = (acqt & 0x00000000FFFFFFFF);
    long msb = (acqt & 0xFFFFFFFF00000000) >> 32;

    // Set LSB.
    res = katherine_cmd_set_acqtime_lsb(&device->control_socket, lsb);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    // Set MSB.
    res = katherine_cmd_set_acqtime_msb(&device->control_socket, msb);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}